

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  double dVar2;
  long lVar3;
  pointer puVar4;
  double *pdVar5;
  iterator iVar6;
  double *pdVar7;
  ulong uVar8;
  ostream *poVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  long lVar14;
  double *pdVar15;
  pointer puVar16;
  undefined1 auVar17 [16];
  double dVar18;
  initializer_list<double> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  vector<double,_std::allocator<double>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> originalIndices;
  vector<double,_std::allocator<double>_> elements;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  enumeratedElements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  allocator_type local_109;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  double local_f0;
  double *local_e8;
  iterator iStack_e0;
  double *local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  double *local_98;
  double *pdStack_90;
  long local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  double dStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_30;
  
  local_48 = 0;
  uStack_40 = 0x3ff0000000000000;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xbfb999999999999a;
  dStack_50 = -0.2;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3ff3333333333333;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3ff199999999999a;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__l,(allocator_type *)&local_108);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"elements=",9);
  printVector<double>(&local_b0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar12 = (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = NAN;
  uVar11 = (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    local_98 = (double *)0x0;
    pdStack_90 = (double *)0x0;
    local_88 = 0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
      emplace_back<unsigned_long&,double_const&>
                ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                  *)&local_98,(unsigned_long *)&local_68,
                 local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      pdVar5 = pdStack_90;
      pdVar13 = local_98;
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_68.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    } while (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)((long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3));
    if (local_98 != pdStack_90) {
      lVar14 = (long)pdStack_90 - (long)local_98;
      uVar8 = lVar14 >> 4;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::operator()(local_98,pdStack_90,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar14 < 0x101) {
        std::operator()(pdVar13,pdVar5);
      }
      else {
        pdVar15 = pdVar13 + 0x20;
        std::operator()(pdVar13,pdVar15);
        if (pdVar15 != pdVar5) {
          pdVar13 = pdVar13 + 0x21;
          do {
            dVar2 = *pdVar15;
            dVar1 = pdVar15[1];
            dVar18 = pdVar15[-1];
            pdVar10 = pdVar15;
            pdVar7 = pdVar13;
            if (dVar18 < dVar1) {
              do {
                pdVar10 = pdVar7;
                pdVar10[-1] = pdVar10[-3];
                *pdVar10 = dVar18;
                dVar18 = pdVar10[-4];
                pdVar7 = pdVar10 + -2;
              } while (dVar18 < dVar1);
              pdVar10 = pdVar10 + -3;
            }
            *pdVar10 = dVar2;
            pdVar10[1] = dVar1;
            pdVar15 = pdVar15 + 2;
            pdVar13 = pdVar13 + 2;
          } while (pdVar15 != pdVar5);
        }
      }
    }
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((ulong)(lVar12 >> 3) >> 1);
    if ((uVar11 & 8) == 0) {
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_c8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - 1);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_68;
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_80,__l_00,&local_109);
    }
    else {
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_c8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_80,__l_01,&local_109);
    }
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_d8 = (double *)0x0;
    local_e8 = (double *)0x0;
    iStack_e0._M_current = (double *)0x0;
    if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar16 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)(local_98 + *puVar16 * 2));
        }
        else {
          *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_98[*puVar16 * 2];
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (iStack_e0._M_current == local_d8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_e8,iStack_e0,
                     local_98 + *puVar16 * 2 + 1);
        }
        else {
          *iStack_e0._M_current = local_98[*puVar16 * 2 + 1];
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 !=
               local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    iVar6._M_current = iStack_e0._M_current;
    pdVar5 = local_e8;
    local_30 = 0.0;
    for (pdVar13 = local_e8; pdVar13 != iStack_e0._M_current; pdVar13 = pdVar13 + 1) {
      local_30 = local_30 + *pdVar13;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68,&local_c8);
    puVar4 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar16 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)iVar6._M_current - (long)pdVar5 >> 3;
    auVar17._8_4_ = (int)((long)iVar6._M_current - (long)pdVar5 >> 0x23);
    auVar17._0_8_ = lVar12;
    auVar17._12_4_ = 0x45300000;
    local_f0 = local_30 /
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dStack_50 = local_f0;
    if (puVar16 != (pointer)0x0) {
      operator_delete(puVar16,(long)puVar4 - (long)puVar16);
    }
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8 != (double *)0x0) {
      operator_delete(local_e8,(long)local_d8 - (long)local_e8);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98 != (double *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median_value=",0xd);
  poVar9 = std::ostream::_M_insert<double>(local_f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"indices=",8);
  printVector<unsigned_long>(&local_108);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    // Let's create an vector of floats to run our algorithm on.
    const std::vector<double> elements {
        1.2, 1.1, -0.1, -0.2, 0, 1
        };

    {
        // Print out the values.
        std::cout << "elements=";
        printVector(elements);
        std::cout << std::endl;
    }

    // At this point we declare what we want - constant value variables
    // "median_value" and indices. They are returned from the lambda and
    // unpacked by means of a structured binding into separate variables
    // right in the current scope.
    // Please notice that we do not capture "elements" into lambda's
    // capture list. A reference (&) capture list enables non-const access
    // to the outer-scope "elements". If for some reason "elements" are
    // declared non-const, lambda's body may by mistake modify its contents.
    // Instead we pass elements as a const reference parameter.
    const auto [median_value, indices] = [](const std::vector<double>& elements)
    {
        // Inside the lambda we allow ourselves some non-functional style by
        // initializing the result variable with a default value which is
        // a tuple of NaN and an empty list to account for possible
        // empty input list.
        auto result = std::make_tuple(
            std::numeric_limits<double>::quiet_NaN(),
            std::vector<size_t>());

        auto size = elements.size();

        if (size > 0)
        {
            // To keep track of the indices which were used to calculate
            // a median, we enumerate elements much alike in python.
            std::vector<std::pair<size_t, double> > enumeratedElements;
            for (size_t index = 0; index < elements.size(); ++index)
            {
                enumeratedElements.emplace_back(index, elements[index]);
            }

            // Now we are all set to sort the elements by values which
            // are stored in "second" field of a tuple.
            std::sort(enumeratedElements.begin(), enumeratedElements.end(),
                [](auto a, auto b){ return a.second > b.second; });

            // A median is calculated out of a middle element of odd-sized
            // lists and out of the two middle elements of an even-sized list.
            std::vector<size_t> indices = (size % 2 == 0) ?
                std::vector<size_t>{size / 2 - 1, size / 2} :
                std::vector<size_t>{size / 2};

            // Let's disentangle indices and values back from the tuples
            // that we are interested in.
            std::vector<size_t> originalIndices;
            std::vector<double> values;
            for (const auto& index : indices)
            {
                originalIndices.push_back(enumeratedElements[index].first);
                values.push_back(enumeratedElements[index].second);
            }

            // Here we stick to the functional paradigm again to mean-reduce
            // one or two values of interest.
            auto median = std::accumulate(values.begin(), values.end(), 0.0) /
                values.size();

            // And return a tuple to be unpacked with a structured binding.
            result = std::make_tuple(median, originalIndices);
        }
        return result;
    }(elements); // Our lambda is one-time use, so just call it.

    // ....... long code here .........

    // By mistake we try to reuse short variable names,
    // but therefore overwrite the original values

    // median_value = 12.3; // Does not compile
    // indices = std::vector<size_t>{100, 200}; // Does not compile

    // Voila! Our fancy const structured bindings save us from a bug,
    // and this happens at compile stage, not after a couple of hours
    // of debugging.

    // ....... more code here .........

    // At some point we again need the original "median_value" or "indices".
    // It is safe to assume that the values are never corrupted
    // thanks to the const qualifier.

    {
        // Print out the results.
        std::cout << "median_value=" << median_value << " ";
        std::cout << "indices=";
        printVector(indices);
        std::cout << std::endl;
    }

    return 0;
}